

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags_storage.hpp
# Opt level: O0

flags_storage<8ul> * __thiscall
tfl::detail::flags_storage<8ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
          (flags_storage<8ul> *this,char zero,char one)

{
  bool bVar1;
  char in_CL;
  undefined7 in_register_00000031;
  char local_79;
  size_t local_58;
  size_t i;
  string local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> res;
  char one_local;
  char zero_local;
  flags_storage<8UL> *this_local;
  
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::reserve((ulong)local_40);
  local_58 = 8;
  while (local_58 != 0) {
    local_58 = local_58 - 1;
    bVar1 = flags_storage<8UL>::get_bit
                      ((flags_storage<8UL> *)CONCAT71(in_register_00000031,zero),local_58);
    local_79 = in_CL;
    if (!bVar1) {
      local_79 = one;
    }
    std::__cxx11::string::operator+=(local_40,local_79);
  }
  std::__cxx11::string::string((string *)this,local_40);
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

auto to_string(CharT zero = CharT('0'), CharT one = CharT('1')) const
    {
        std::basic_string<CharT, Traits, Allocator> res;
        res.reserve(N);
        for (size_t i = N; i > 0;)
            res += get_bit(--i) ? one : zero;
        return res;
    }